

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  string *psVar1;
  _Head_base<0UL,_cmELFInternal_*,_false> _Var2;
  _Head_base<0UL,_cmELFInternal_*,_false> _Var3;
  uint uVar4;
  long *plVar5;
  _Head_base<0UL,_cmELFInternal_*,_false> local_50;
  long *local_48;
  uint local_3c;
  char ident [16];
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_28;
  char *fname_local;
  
  (this->Internal)._M_t.super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>.
  _M_t.super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
  super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl = (cmELFInternal *)0x0;
  psVar1 = &this->ErrorMessage;
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  fname_local = fname;
  std::make_unique<std::ifstream,char_const*&,std::_Ios_Openmode_const&>
            ((char **)&local_48,(_Ios_Openmode *)&fname_local);
  if ((local_48 == (long *)0x0) ||
     ((*(byte *)((long)local_48 + *(long *)(*local_48 + -0x18) + 0x20) & 5) != 0)) {
    std::__cxx11::string::assign((char *)psVar1);
    goto LAB_00392b93;
  }
  plVar5 = (long *)std::istream::read((char *)local_48,(long)ident);
  if ((((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) ||
      (plVar5 = (long *)std::istream::seekg(local_48,0,0),
      (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0)) ||
     (ident._0_4_ != 0x464c457f)) {
    std::__cxx11::string::assign((char *)psVar1);
    goto LAB_00392b93;
  }
  uVar4 = (uint)(byte)ident[5];
  if (ident[5] == '\x01') {
LAB_00392b4f:
    local_3c = uVar4;
    if (ident[4] == '\x02') {
      local_28._M_t.
      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                        )this;
      std::
      make_unique<cmELFInternalImpl<cmELFTypes64>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                ((cmELF **)&local_50,&local_28,(ByteOrderType *)&local_48);
    }
    else {
      if (ident[4] != '\x01') goto LAB_00392c07;
      local_28._M_t.
      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                        )this;
      std::
      make_unique<cmELFInternalImpl<cmELFTypes32>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                ((cmELF **)&local_50,&local_28,(ByteOrderType *)&local_48);
    }
    _Var3._M_head_impl = local_50._M_head_impl;
    local_50._M_head_impl = (cmELFInternal *)0x0;
    _Var2._M_head_impl =
         (this->Internal)._M_t.
         super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
         super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
         super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl;
    (this->Internal)._M_t.super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>.
    _M_t.super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
    super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl = _Var3._M_head_impl;
    if ((_Var2._M_head_impl != (cmELFInternal *)0x0) &&
       ((**(code **)((long)(_Var2._M_head_impl)->_vptr_cmELFInternal + 8))(),
       local_50._M_head_impl != (cmELFInternal *)0x0)) {
      (*(local_50._M_head_impl)->_vptr_cmELFInternal[1])();
    }
  }
  else {
    if (ident[5] == '\x02') {
      uVar4 = 0;
      goto LAB_00392b4f;
    }
LAB_00392c07:
    std::__cxx11::string::assign((char *)psVar1);
  }
LAB_00392b93:
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
{
  // Try to open the file.
  auto fin = cm::make_unique<cmsys::ifstream>(fname, std::ios::binary);

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes32>>(
      this, std::move(fin), order);
  } else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes64>>(
      this, std::move(fin), order);
  } else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }
}